

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O3

Value * __thiscall flow::IRBuilder::createB2S(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *pCVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Value *local_30;
  LiteralType local_24;
  
  local_30 = rhs;
  if (rhs->type_ != Boolean) {
    __assert_fail("rhs->type() == LiteralType::Boolean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x23d,"Value *flow::IRBuilder::createB2S(Value *, const std::string &)");
  }
  lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0)
  ;
  if (lVar1 == 0) {
    local_24 = String;
    makeName(&local_50,this,name);
    pCVar2 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
              *)insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                          (this,&local_24,&local_30,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return (Value *)pCVar2;
    }
  }
  else {
    pcVar3 = "false";
    if ((ulong)*(byte *)(lVar1 + 0x48) != 0) {
      pcVar3 = "true";
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar3,pcVar3 + ((ulong)*(byte *)(lVar1 + 0x48) ^ 5));
    pCVar2 = IRProgram::
             get<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string>
                       (this->program_,&this->program_->strings_,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return (Value *)pCVar2;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return (Value *)pCVar2;
}

Assistant:

Value* IRBuilder::createB2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(rhs))
    return get(a->get() ? "true" : "false");

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}